

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmMakefile *this_00;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  string *psVar4;
  string *psVar5;
  char *pcVar6;
  ulong uVar7;
  cmGlobalGenerator *this_01;
  cmake *this_02;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  bool local_46a;
  bool local_44a;
  string local_428;
  string local_408 [32];
  long local_3e8;
  size_type dot_pos;
  undefined1 local_3c0 [8];
  string lang;
  undefined1 local_398 [6];
  bool replaceExt;
  byte local_371;
  undefined1 local_370 [7];
  bool keptSourceExtension;
  RegularExpression var;
  undefined1 local_138 [6];
  bool isPchObject;
  cmValue local_118;
  cmValue pchExtension;
  string local_108;
  cmValue local_e8;
  cmValue unitySourceFile;
  undefined1 local_c0 [8];
  string objectName;
  undefined1 local_98 [6];
  bool subBinary;
  bool relBinary;
  string relFromBinary;
  bool subSource;
  undefined1 local_60 [7];
  bool relSource;
  string relFromSource;
  string *fullPath;
  char *customOutputExtension_local;
  bool *hasSourceExtension_local;
  string *dir_max_local;
  cmSourceFile *source_local;
  cmLocalGenerator *this_local;
  
  relFromSource.field_2._8_8_ = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar4 = GetSourceDirectory_abi_cxx11_(this);
  psVar5 = GetCurrentSourceDirectory_abi_cxx11_(this);
  anon_unknown.dwarf_8f7285::relativeIfUnder
            ((string *)local_60,psVar4,psVar5,(string *)relFromSource.field_2._8_8_);
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xfd8,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_60);
  bVar1 = (bVar2 ^ 0xffU) & 1;
  local_44a = false;
  if (bVar1 != 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
    local_44a = *pcVar6 != '.';
  }
  relFromBinary.field_2._M_local_buf[0xb] = local_44a;
  psVar4 = GetBinaryDirectory_abi_cxx11_(this);
  psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(this);
  anon_unknown.dwarf_8f7285::relativeIfUnder
            ((string *)local_98,psVar4,psVar5,(string *)relFromSource.field_2._8_8_);
  bVar3 = std::__cxx11::string::empty();
  if (((bVar3 ^ 0xff) & 1) == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xfdf,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_98);
  objectName.field_2._M_local_buf[0xf] = (bVar2 ^ 0xffU) & 1;
  local_46a = false;
  if (objectName.field_2._M_local_buf[0xf] != 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
    local_46a = *pcVar6 != '.';
  }
  objectName.field_2._M_local_buf[0xe] = local_46a;
  std::__cxx11::string::string((string *)local_c0);
  if (((bVar1 == 0) || ((objectName.field_2._M_local_buf[0xf] & 1U) != 0)) &&
     (((relFromBinary.field_2._M_local_buf[0xb] & 1U) == 0 ||
      ((objectName.field_2._M_local_buf[0xe] & 1U) != 0)))) {
    if ((((objectName.field_2._M_local_buf[0xf] & 1U) == 0) || (bVar1 != 0)) &&
       (((objectName.field_2._M_local_buf[0xe] & 1U) == 0 ||
        ((relFromBinary.field_2._M_local_buf[0xb] & 1U) != 0)))) {
      uVar10 = std::__cxx11::string::length();
      uVar7 = std::__cxx11::string::length();
      if (uVar7 <= uVar10) {
        std::__cxx11::string::operator=((string *)local_c0,(string *)local_60);
        goto LAB_0059cce2;
      }
    }
    std::__cxx11::string::operator=((string *)local_c0,(string *)local_98);
  }
  else {
    std::__cxx11::string::operator=((string *)local_c0,(string *)local_60);
  }
LAB_0059cce2:
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_c0);
  if (bVar2) {
    this_01 = GetGlobalGenerator(this);
    this_02 = cmGlobalGenerator::GetCMakeInstance(this_01);
    bVar2 = cmake::GetIsInTryCompile(this_02);
    if (bVar2) {
      psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetFilenameName((string *)&unitySourceFile,psVar4);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&unitySourceFile);
      std::__cxx11::string::~string((string *)&unitySourceFile);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"UNITY_SOURCE_FILE",
             (allocator<char> *)((long)&pchExtension.Value + 7));
  local_e8 = cmSourceFile::GetProperty(source,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pchExtension.Value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"PCH_EXTENSION",(allocator<char> *)&var.field_0x22f);
  local_118 = cmSourceFile::GetProperty(source,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  std::allocator<char>::~allocator((allocator<char> *)&var.field_0x22f);
  lVar8 = std::__cxx11::string::find(local_c0,0x1283d1c);
  var._558_1_ = lVar8 != -1;
  bVar2 = cmValue::operator_cast_to_bool(&local_e8);
  fullPath = (string *)customOutputExtension;
  if (((bVar2) || (bVar2 = cmValue::operator_cast_to_bool(&local_118), bVar2)) ||
     ((var._558_1_ & 1) != 0)) {
    bVar2 = cmValue::operator_cast_to_bool(&local_118);
    if (bVar2) {
      cmValue::operator->[abi_cxx11_(&local_118);
      fullPath = (string *)std::__cxx11::string::c_str();
    }
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)local_370,"(CMakeFiles/[^/]+.dir/)");
    bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_370,(string *)local_c0);
    if (bVar2) {
      sVar9 = cmsys::RegularExpression::start((RegularExpression *)local_370);
      cmsys::RegularExpression::end((RegularExpression *)local_370);
      cmsys::RegularExpression::start((RegularExpression *)local_370);
      std::__cxx11::string::erase((ulong)local_c0,sVar9);
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_370);
  }
  local_371 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398,"KEEP_EXTENSION",
             (allocator<char> *)(lang.field_2._M_local_buf + 0xf));
  bVar2 = cmSourceFile::GetPropertyAsBool(source,(string *)local_398);
  std::__cxx11::string::~string((string *)local_398);
  std::allocator<char>::~allocator((allocator<char> *)(lang.field_2._M_local_buf + 0xf));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    lang.field_2._M_local_buf[0xe] = NeedBackwardsCompatibility_2_4(this);
    if (!(bool)lang.field_2._M_local_buf[0xe]) {
      cmSourceFile::GetLanguage_abi_cxx11_((string *)local_3c0,source);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        this_00 = this->Makefile;
        cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[26]>
                  ((string *)&dot_pos,(char (*) [7])0x1244722,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                   (char (*) [26])"_OUTPUT_EXTENSION_REPLACE");
        lang.field_2._M_local_buf[0xe] = cmMakefile::IsOn(this_00,(string *)&dot_pos);
        std::__cxx11::string::~string((string *)&dot_pos);
      }
      std::__cxx11::string::~string((string *)local_3c0);
    }
    if (((lang.field_2._M_local_buf[0xe] & 1U) != 0) || (fullPath != (string *)0x0)) {
      local_371 = 0;
      local_3e8 = std::__cxx11::string::rfind((char)local_c0,0x2e);
      if (local_3e8 != -1) {
        std::__cxx11::string::substr((ulong)local_408,(ulong)local_c0);
        std::__cxx11::string::operator=((string *)local_c0,local_408);
        std::__cxx11::string::~string(local_408);
      }
    }
    if (fullPath == (string *)0x0) {
      cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                (&local_428,this->GlobalGenerator,source);
      std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_428);
      std::__cxx11::string::~string((string *)&local_428);
    }
    else {
      std::__cxx11::string::operator+=((string *)local_c0,(char *)fullPath);
    }
  }
  if (hasSourceExtension != (bool *)0x0) {
    *hasSourceExtension = (bool)(local_371 & 1);
  }
  psVar4 = CreateSafeUniqueObjectFileName(this,(string *)local_c0,dir_max);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = relativeIfUnder(
    this->GetSourceDirectory(), this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = relativeIfUnder(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
  // NOLINTNEXTLINE(bugprone-branch-clone)
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource) ||
             relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Ensure that for the CMakeFiles/<target>.dir/generated_source_file
  // we don't end up having:
  // CMakeFiles/<target>.dir/CMakeFiles/<target>.dir/generated_source_file.obj
  cmValue unitySourceFile = source.GetProperty("UNITY_SOURCE_FILE");
  cmValue pchExtension = source.GetProperty("PCH_EXTENSION");
  const bool isPchObject = objectName.find("cmake_pch") != std::string::npos;
  if (unitySourceFile || pchExtension || isPchObject) {
    if (pchExtension) {
      customOutputExtension = pchExtension->c_str();
    }

    cmsys::RegularExpression var("(CMakeFiles/[^/]+.dir/)");
    if (var.find(objectName)) {
      objectName.erase(var.start(), var.end() - var.start());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        replaceExt = this->Makefile->IsOn(
          cmStrCat("CMAKE_", lang, "_OUTPUT_EXTENSION_REPLACE"));
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}